

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

QList<QBenchmarkResult> * QTest::qMedian(QList<QList<QBenchmarkResult>_> *container)

{
  long lVar1;
  qsizetype qVar2;
  iterator iVar3;
  iterator this;
  QList<QList<QBenchmarkResult>_> *in_RSI;
  QList<QBenchmarkResult> *in_RDI;
  long in_FS_OFFSET;
  int middle;
  int count;
  QList<QList<QBenchmarkResult>_> containerCopy;
  QList<QBenchmarkResult> *in_stack_ffffffffffffff68;
  QList<QBenchmarkResult> *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = QList<QList<QBenchmarkResult>_>::size(in_RSI);
  if ((int)qVar2 == 0) {
    memset(in_RDI,0,0x18);
    QList<QBenchmarkResult>::QList((QList<QBenchmarkResult> *)0x14e21f);
  }
  else if ((int)qVar2 == 1) {
    QList<QList<QBenchmarkResult>_>::front((QList<QList<QBenchmarkResult>_> *)0x14e235);
    QList<QBenchmarkResult>::QList(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else {
    QList<QList<QBenchmarkResult>_>::QList
              ((QList<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff70,
               (QList<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff68);
    iVar3 = QList<QList<QBenchmarkResult>_>::begin
                      ((QList<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff70);
    this = QList<QList<QBenchmarkResult>_>::end
                     ((QList<QList<QBenchmarkResult>_> *)in_stack_ffffffffffffff70);
    std::
    sort<QList<QList<QBenchmarkResult>>::iterator,QTest::qMedian(QList<QList<QBenchmarkResult>>const&)::__0>
              (iVar3.i,this.i);
    QList<QList<QBenchmarkResult>_>::at
              ((QList<QList<QBenchmarkResult>_> *)this.i,(qsizetype)in_stack_ffffffffffffff68);
    QList<QBenchmarkResult>::QList(this.i,in_stack_ffffffffffffff68);
    QList<QList<QBenchmarkResult>_>::~QList((QList<QList<QBenchmarkResult>_> *)0x14e2f6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QList<QBenchmarkResult> qMedian(const QList<QList<QBenchmarkResult>> &container)
{
    const int count = container.size();
    if (count == 0)
        return {};

    if (count == 1)
        return container.front();

    QList<QList<QBenchmarkResult>> containerCopy = container;
    std::sort(containerCopy.begin(), containerCopy.end(),
              [](const QList<QBenchmarkResult> &a, const QList<QBenchmarkResult> &b) {
        return a.first() < b.first();
    });

    const int middle = count / 2;

    // ### handle even-sized containers here by doing an arithmetic mean of the two middle items.
    return containerCopy.at(middle);
}